

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O1

bool __thiscall SQCompilation::NodeEqualChecker::check(NodeEqualChecker *this,Node *lhs,Node *rhs)

{
  TreeOp TVar1;
  bool bVar2;
  int iVar3;
  
LAB_0015ad24:
  if (lhs == rhs) {
switchD_0015ad63_caseD_b:
    return true;
  }
  if ((FunctionDecl *)lhs == (FunctionDecl *)0x0) {
    return false;
  }
  if ((FunctionDecl *)rhs == (FunctionDecl *)0x0) {
    return false;
  }
  TVar1 = (((FunctionDecl *)lhs)->super_Decl).super_Statement.super_Node._op;
  if (TVar1 != (((FunctionDecl *)rhs)->super_Decl).super_Statement.super_Node._op) {
    return false;
  }
  switch(TVar1) {
  case TO_BLOCK:
    if (((((FunctionDecl *)lhs)->super_Decl).super_Statement.super_Node.field_0x1c ==
         (((FunctionDecl *)rhs)->super_Decl).super_Statement.super_Node.field_0x1c) &&
       ((((FunctionDecl *)lhs)->super_Decl).super_Statement.super_Node.field_0x1d ==
        (((FunctionDecl *)rhs)->super_Decl).super_Statement.super_Node.field_0x1d)) {
      bVar2 = cmpNodeVector<SQCompilation::Statement>
                        (this,(ArenaVector<SQCompilation::Statement_*> *)
                              &((FunctionDecl *)lhs)->_arena,
                         (ArenaVector<SQCompilation::Statement_*> *)&((FunctionDecl *)rhs)->_arena);
      return bVar2;
    }
    break;
  case TO_IF:
    bVar2 = cmpIf(this,(IfStatement *)lhs,(IfStatement *)rhs);
    return bVar2;
  case TO_WHILE:
    bVar2 = cmpWhile(this,(WhileStatement *)lhs,(WhileStatement *)rhs);
    return bVar2;
  case TO_DOWHILE:
    bVar2 = cmpDoWhile(this,(DoWhileStatement *)lhs,(DoWhileStatement *)rhs);
    return bVar2;
  case TO_FOR:
    bVar2 = cmpFor(this,(ForStatement *)lhs,(ForStatement *)rhs);
    return bVar2;
  case TO_FOREACH:
    bVar2 = cmpForeach(this,(ForeachStatement *)lhs,(ForeachStatement *)rhs);
    return bVar2;
  case TO_SWITCH:
    bVar2 = cmpSwitch(this,(SwitchStatement *)lhs,(SwitchStatement *)rhs);
    return bVar2;
  case TO_RETURN:
    if (*(char *)&((FunctionDecl *)lhs)->_name != *(char *)&((FunctionDecl *)rhs)->_name) {
      return false;
    }
  case TO_YIELD:
  case TO_THROW:
  case TO_EXPR_STMT:
  case TO_NOT:
  case TO_BNOT:
  case TO_NEG:
  case TO_TYPEOF:
  case TO_RESUME:
  case TO_CLONE:
  case TO_PAREN:
  case TO_DELETE:
  case TO_DECL_EXPR:
    lhs = (Node *)((FunctionDecl *)lhs)->_arena;
    rhs = (Node *)((FunctionDecl *)rhs)->_arena;
    goto LAB_0015ad24;
  case TO_TRY:
    bVar2 = cmpTry(this,(TryStatement *)lhs,(TryStatement *)rhs);
    return bVar2;
  case TO_BREAK:
  case TO_CONTINUE:
  case TO_EMPTY:
  case TO_BASE:
  case TO_ROOT_TABLE_ACCESS:
    goto switchD_0015ad63_caseD_b;
  case TO_ID:
    iVar3 = strcmp((char *)((FunctionDecl *)lhs)->_arena,(char *)((FunctionDecl *)rhs)->_arena);
    return iVar3 == 0;
  case TO_COMMA:
  case TO_ARRAYEXPR:
    bVar2 = cmpNodeVector<SQCompilation::Expr>
                      (this,(ArenaVector<SQCompilation::Expr_*> *)&((FunctionDecl *)lhs)->_arena,
                       (ArenaVector<SQCompilation::Expr_*> *)&((FunctionDecl *)rhs)->_arena);
    return bVar2;
  case TO_NULLC:
  case TO_ASSIGN:
  case TO_OROR:
  case TO_ANDAND:
  case TO_OR:
  case TO_XOR:
  case TO_AND:
  case TO_NE:
  case TO_EQ:
  case TO_3CMP:
  case TO_GE:
  case TO_GT:
  case TO_LE:
  case TO_LT:
  case TO_IN:
  case TO_INSTANCEOF:
  case TO_USHR:
  case TO_SHR:
  case TO_SHL:
  case TO_MUL:
  case TO_DIV:
  case TO_MOD:
  case TO_ADD:
  case TO_SUB:
  case TO_NEWSLOT:
  case TO_PLUSEQ:
  case TO_MINUSEQ:
  case TO_MULEQ:
  case TO_DIVEQ:
  case TO_MODEQ:
    bVar2 = cmpBinary(this,(BinExpr *)lhs,(BinExpr *)rhs);
    return bVar2;
  case TO_LITERAL:
    bVar2 = cmpLiterals(this,(LiteralExpr *)lhs,(LiteralExpr *)rhs);
    return bVar2;
  case TO_INC:
    bVar2 = cmpIncExpr(this,(IncExpr *)lhs,(IncExpr *)rhs);
    return bVar2;
  case TO_GETFIELD:
    bVar2 = cmpGetField(this,(GetFieldExpr *)lhs,(GetFieldExpr *)rhs);
    return bVar2;
  case TO_GETSLOT:
    bVar2 = cmpGetSlot(this,(GetSlotExpr *)lhs,(GetSlotExpr *)rhs);
    return bVar2;
  case TO_CALL:
    bVar2 = cmpCallExpr(this,(CallExpr *)lhs,(CallExpr *)rhs);
    return bVar2;
  case TO_TERNARY:
    bVar2 = cmpTernary(this,(TerExpr *)lhs,(TerExpr *)rhs);
    return bVar2;
  case TO_VAR:
    if (*(char *)&(((FunctionDecl *)lhs)->_parameters)._arena ==
        *(char *)&(((FunctionDecl *)rhs)->_parameters)._arena) goto switchD_0015ad63_caseD_48;
    break;
  case TO_PARAM:
switchD_0015ad63_caseD_48:
    bVar2 = cmpValueDecl(this,(ValueDecl *)lhs,(ValueDecl *)rhs);
    return bVar2;
  case TO_CONST:
    bVar2 = cmpConst(this,(ConstDecl *)lhs,(ConstDecl *)rhs);
    return bVar2;
  case TO_DECL_GROUP:
    bVar2 = cmpNodeVector<SQCompilation::VarDecl>
                      (this,(ArenaVector<SQCompilation::VarDecl_*> *)&((FunctionDecl *)lhs)->_arena,
                       (ArenaVector<SQCompilation::VarDecl_*> *)&((FunctionDecl *)rhs)->_arena);
    return bVar2;
  case TO_DESTRUCTURE:
    goto switchD_0015ad63_caseD_4b;
  case TO_FUNCTION:
  case TO_CONSTRUCTOR:
    bVar2 = cmpFunction(this,(FunctionDecl *)lhs,(FunctionDecl *)rhs);
    return bVar2;
  case TO_CLASS:
    bVar2 = cmpClass(this,(ClassDecl *)lhs,(ClassDecl *)rhs);
    return bVar2;
  case TO_ENUM:
    bVar2 = cmpEnumDecl(this,(EnumDecl *)lhs,(EnumDecl *)rhs);
    return bVar2;
  case TO_TABLE:
    bVar2 = cmpTable(this,(TableDecl *)lhs,(TableDecl *)rhs);
    return bVar2;
  }
  return false;
switchD_0015ad63_caseD_4b:
  if ((((FunctionDecl *)lhs)->_parameters)._size != (((FunctionDecl *)rhs)->_parameters)._size) {
    return false;
  }
  lhs = (Node *)(((FunctionDecl *)lhs)->_parameters)._vals;
  rhs = (Node *)(((FunctionDecl *)rhs)->_parameters)._vals;
  goto LAB_0015ad24;
}

Assistant:

bool check(const Node *lhs, const Node *rhs) const {

    if (lhs == rhs)
      return true;

    if (!lhs || !rhs)
      return false;

    if (lhs->op() != rhs->op())
      return false;

    switch (lhs->op())
    {
    case TO_BLOCK:      return cmpBlock((const Block *)lhs, (const Block *)rhs);
    case TO_IF:         return cmpIf((const IfStatement *)lhs, (const IfStatement *)rhs);
    case TO_WHILE:      return cmpWhile((const WhileStatement *)lhs, (const WhileStatement *)rhs);
    case TO_DOWHILE:    return cmpDoWhile((const DoWhileStatement *)lhs, (const DoWhileStatement *)rhs);
    case TO_FOR:        return cmpFor((const ForStatement *)lhs, (const ForStatement *)rhs);
    case TO_FOREACH:    return cmpForeach((const ForeachStatement *)lhs, (const ForeachStatement *)rhs);
    case TO_SWITCH:     return cmpSwitch((const SwitchStatement *)lhs, (const SwitchStatement *)rhs);
    case TO_RETURN:
      return cmpReturn((const ReturnStatement *)lhs, (const ReturnStatement *)rhs);
    case TO_YIELD:
    case TO_THROW:
      return cmpTerminate((const TerminateStatement *)lhs, (const TerminateStatement *)rhs);
    case TO_TRY:
      return cmpTry((const TryStatement *)lhs, (const TryStatement *)rhs);
    case TO_BREAK:
    case TO_CONTINUE:
    case TO_EMPTY:
    case TO_BASE:
    case TO_ROOT_TABLE_ACCESS:
      return true;
    case TO_EXPR_STMT:
      return cmpExprStmt((const ExprStatement *)lhs, (const ExprStatement *)rhs);

      //case TO_STATEMENT_MARK:
    case TO_ID:         return cmpId((const Id *)lhs, (const Id *)rhs);
    case TO_COMMA:      return cmpComma((const CommaExpr *)lhs, (const CommaExpr *)rhs);
    case TO_NULLC:
    case TO_ASSIGN:
    case TO_OROR:
    case TO_ANDAND:
    case TO_OR:
    case TO_XOR:
    case TO_AND:
    case TO_NE:
    case TO_EQ:
    case TO_3CMP:
    case TO_GE:
    case TO_GT:
    case TO_LE:
    case TO_LT:
    case TO_IN:
    case TO_INSTANCEOF:
    case TO_USHR:
    case TO_SHR:
    case TO_SHL:
    case TO_MUL:
    case TO_DIV:
    case TO_MOD:
    case TO_ADD:
    case TO_SUB:
    case TO_NEWSLOT:
    case TO_PLUSEQ:
    case TO_MINUSEQ:
    case TO_MULEQ:
    case TO_DIVEQ:
    case TO_MODEQ:
      return cmpBinary((const BinExpr *)lhs, (const BinExpr *)rhs);
    case TO_NOT:
    case TO_BNOT:
    case TO_NEG:
    case TO_TYPEOF:
    case TO_RESUME:
    case TO_CLONE:
    case TO_PAREN:
    case TO_DELETE:
      return cmpUnary((const UnExpr *)lhs, (const UnExpr *)rhs);
    case TO_LITERAL:
      return cmpLiterals((const LiteralExpr *)lhs, (const LiteralExpr *)rhs);
    case TO_INC:
      return cmpIncExpr((const IncExpr *)lhs, (const IncExpr *)rhs);
    case TO_DECL_EXPR:
      return cmpDeclExpr((const DeclExpr *)lhs, (const DeclExpr *)rhs);
    case TO_ARRAYEXPR:
      return cmpArrayExpr((const ArrayExpr *)lhs, (const ArrayExpr *)rhs);
    case TO_GETFIELD:
      return cmpGetField((const GetFieldExpr *)lhs, (const GetFieldExpr *)rhs);
    case TO_GETSLOT:
      return cmpGetSlot((const GetSlotExpr *)lhs, (const GetSlotExpr *)rhs);
    case TO_CALL:
      return cmpCallExpr((const CallExpr *)lhs, (const CallExpr *)rhs);
    case TO_TERNARY:
      return cmpTernary((const TerExpr *)lhs, (const TerExpr *)rhs);
      //case TO_EXPR_MARK:
    case TO_VAR:
      return cmpVarDecl((const VarDecl *)lhs, (const VarDecl *)rhs);
    case TO_PARAM:
      return cmpValueDecl((const ValueDecl *)lhs, (const ValueDecl *)rhs);
    case TO_CONST:
      return cmpConst((const ConstDecl *)lhs, (const ConstDecl *)rhs);
    case TO_DECL_GROUP:
      return cmpDeclGroup((const DeclGroup *)lhs, (const DeclGroup *)rhs);
    case TO_DESTRUCTURE:
      return cmpDestructDecl((const DestructuringDecl *)lhs, (const DestructuringDecl *)rhs);
    case TO_FUNCTION:
    case TO_CONSTRUCTOR:
      return cmpFunction((const FunctionDecl *)lhs, (const FunctionDecl *)rhs);
    case TO_CLASS:
      return cmpClass((const ClassDecl *)lhs, (const ClassDecl *)rhs);
    case TO_ENUM:
      return cmpEnumDecl((const EnumDecl *)lhs, (const EnumDecl *)rhs);
    case TO_TABLE:
      return cmpTable((const TableDecl *)lhs, (const TableDecl *)rhs);
    case TO_SETFIELD:
    case TO_SETSLOT:
    default:
      assert(0);
      return false;
    }
  }